

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::Subprocess::Start
          (Subprocess *this,string *program,SearchMode search_mode)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  char *__dest;
  LogMessage *this_00;
  int *piVar4;
  char *pcVar5;
  int stdout_pipe [2];
  int stdin_pipe [2];
  char *argv [2];
  LogMessage local_40;
  char *local_30;
  
  iVar1 = pipe(stdin_pipe);
  if (iVar1 == -1) {
    pcVar5 = "pipe(stdin_pipe) != -1";
    iVar1 = 0x135;
  }
  else {
    iVar1 = pipe(stdout_pipe);
    if (iVar1 != -1) {
      pcVar5 = (program->_M_dataplus)._M_p;
      sVar3 = strlen(pcVar5);
      __dest = (char *)malloc(sVar3 + 1);
      if (__dest != (char *)0x0) {
        strcpy(__dest,pcVar5);
      }
      argv[1] = (char *)0x0;
      argv[0] = __dest;
      _Var2 = fork();
      this->child_pid_ = _Var2;
      if (_Var2 != -1) {
        if (_Var2 != 0) {
          free(__dest);
          close(stdin_pipe[0]);
          close(stdout_pipe[1]);
          this->child_stdin_ = stdin_pipe[1];
          this->child_stdout_ = stdout_pipe[0];
          return;
        }
        dup2(stdin_pipe[0],0);
        dup2(stdout_pipe[1],1);
        close(stdin_pipe[0]);
        close(stdin_pipe[1]);
        close(stdout_pipe[0]);
        close(stdout_pipe[1]);
        if (search_mode == EXACT_NAME) {
          execv(__dest,argv);
        }
        else if (search_mode == SEARCH_PATH) {
          execvp(__dest,argv);
        }
        pcVar5 = argv[0];
        sVar3 = strlen(argv[0]);
        write(2,pcVar5,sVar3);
        write(2,
              ": program not found or is not executable\nPlease specify a program using absolute path or make sure the program is available in your PATH system variable\n"
              ,0x99);
        _exit(1);
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
                 ,0x13c);
      this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (&local_40,(char (*) [7])"fork: ");
      piVar4 = __errno_location();
      local_30 = strerror(*piVar4);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(this_00,&local_30);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
    pcVar5 = "pipe(stdout_pipe) != -1";
    iVar1 = 0x136;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)argv,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
             ,iVar1,pcVar5);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)argv);
}

Assistant:

void Subprocess::Start(const std::string& program, SearchMode search_mode) {
  // Note that we assume that there are no other threads, thus we don't have to
  // do crazy stuff like using socket pairs or avoiding libc locks.

  // [0] is read end, [1] is write end.
  int stdin_pipe[2];
  int stdout_pipe[2];

  ABSL_CHECK(pipe(stdin_pipe) != -1);
  ABSL_CHECK(pipe(stdout_pipe) != -1);

  char* argv[2] = {portable_strdup(program.c_str()), nullptr};

  child_pid_ = fork();
  if (child_pid_ == -1) {
    ABSL_LOG(FATAL) << "fork: " << strerror(errno);
  } else if (child_pid_ == 0) {
    // We are the child.
    dup2(stdin_pipe[0], STDIN_FILENO);
    dup2(stdout_pipe[1], STDOUT_FILENO);

    close(stdin_pipe[0]);
    close(stdin_pipe[1]);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);

    switch (search_mode) {
      case SEARCH_PATH:
        execvp(argv[0], argv);
        break;
      case EXACT_NAME:
        execv(argv[0], argv);
        break;
    }

    // Write directly to STDERR_FILENO to avoid stdio code paths that may do
    // stuff that is unsafe here.
    int ignored;
    ignored = write(STDERR_FILENO, argv[0], strlen(argv[0]));
    const char* message =
        ": program not found or is not executable\n"
        "Please specify a program using absolute path or make sure "
        "the program is available in your PATH system variable\n";
    ignored = write(STDERR_FILENO, message, strlen(message));
    (void)ignored;

    // Must use _exit() rather than exit() to avoid flushing output buffers
    // that will also be flushed by the parent.
    _exit(1);
  } else {
    free(argv[0]);

    close(stdin_pipe[0]);
    close(stdout_pipe[1]);

    child_stdin_ = stdin_pipe[1];
    child_stdout_ = stdout_pipe[0];
  }
}